

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::createTLExtra(QWidgetPrivate *this)

{
  bool bVar1;
  pointer this_00;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTLWExtra *x;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QWidgetPrivate *this_01;
  QFlagsStorage<Qt::WindowType> local_24;
  undefined8 local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x362abe);
  if (!bVar1) {
    createExtra(in_RDI);
  }
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x362ada);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x362ae6);
  if (!bVar1) {
    std::make_unique<QTLWExtra>();
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x362b06);
    std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator=
              ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)in_RDI,
               (unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::~unique_ptr
              ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)in_RDI);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x362b2f);
    this_00 = std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::get
                        ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x362b3b);
    this_00->backingStore = (QBackingStore *)0x0;
    this_00->sharedPainter = (QPainter *)0x0;
    this_00->inch = 0;
    this_00->incw = 0;
    this_00->baseh = 0;
    this_00->basew = 0;
    QRect::setCoords((QRect *)this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    QRect::QRect((QRect *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffbc
                 ,in_stack_ffffffffffffffb8);
    (this_00->normalGeometry).x1 = (Representation)(undefined4)local_20;
    (this_00->normalGeometry).y1 = (Representation)local_20._4_4_;
    (this_00->normalGeometry).x2 = (Representation)(undefined4)local_18;
    (this_00->normalGeometry).y2 = (Representation)local_18._4_4_;
    memset(&local_24,0,4);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x362bfe);
    (this_00->savedFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
    super_QFlagsStorage<Qt::WindowType>.i = local_24.i;
    *(ushort *)&this_00->field_0xe0 = *(ushort *)&this_00->field_0xe0 & 0xff00 | 0xff;
    *(ushort *)&this_00->field_0xe0 = *(ushort *)&this_00->field_0xe0 & 0xfeff;
    *(ushort *)&this_00->field_0xe0 = *(ushort *)&this_00->field_0xe0 & 0xfdff;
    *(ushort *)&this_00->field_0xe0 = *(ushort *)&this_00->field_0xe0 & 0xfbff;
    *(ushort *)&this_00->field_0xe0 = *(ushort *)&this_00->field_0xe0 & 0xf7ff;
    this_00->window = (QWidgetWindow *)0x0;
    QPointer<QScreen>::operator=
              ((QPointer<QScreen> *)in_RDI,
               (QScreen *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createTLExtra()
{
    if (!extra)
        createExtra();
    if (!extra->topextra) {
        extra->topextra = std::make_unique<QTLWExtra>();
        QTLWExtra* x = extra->topextra.get();
        x->backingStore = nullptr;
        x->sharedPainter = nullptr;
        x->incw = x->inch = 0;
        x->basew = x->baseh = 0;
        x->frameStrut.setCoords(0, 0, 0, 0);
        x->normalGeometry = QRect(0,0,-1,-1);
        x->savedFlags = { };
        x->opacity = 255;
        x->posIncludesFrame = 0;
        x->sizeAdjusted = false;
        x->embedded = 0;
        x->explicitContentsMarginsRespectsSafeArea = 0;
        x->window = nullptr;
        x->initialScreen = nullptr;

#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "tlextra" << ++count;
#endif
    }
}